

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DropTrigger(Parse *pParse,SrcList *pName,int noErr)

{
  sqlite3 *db;
  char *zName;
  char *pKey;
  int iVar1;
  int iVar2;
  HashElem *pHVar3;
  uint iDb;
  Trigger *pTrigger;
  uint uVar4;
  bool bVar5;
  
  db = pParse->db;
  if ((db->mallocFailed == '\0') && (iVar1 = sqlite3ReadSchema(pParse), iVar1 == 0)) {
    zName = pName->a[0].zDatabase;
    iVar1 = db->nDb;
    if (iVar1 < 1) {
      pTrigger = (Trigger *)0x0;
    }
    else {
      pKey = pName->a[0].zName;
      pTrigger = (Trigger *)0x0;
      uVar4 = 0;
      do {
        iDb = uVar4 < 2 ^ uVar4;
        if ((zName == (char *)0x0) || (iVar2 = sqlite3DbIsNamed(db,iDb,zName), iVar2 != 0)) {
          pHVar3 = findElementWithHash(&(db->aDb[iDb].pSchema)->trigHash,pKey,(uint *)0x0);
          pTrigger = (Trigger *)pHVar3->data;
          bVar5 = pTrigger != (Trigger *)0x0;
        }
        else {
          bVar5 = false;
        }
      } while ((!bVar5) && (bVar5 = iVar1 - 1U != uVar4, uVar4 = uVar4 + 1, bVar5));
    }
    if (pTrigger == (Trigger *)0x0) {
      if (noErr == 0) {
        sqlite3ErrorMsg(pParse,"no such trigger: %S",pName->a);
      }
      else {
        sqlite3CodeVerifyNamedSchema(pParse,zName);
      }
      pParse->checkSchema = '\x01';
    }
    else {
      sqlite3DropTriggerPtr(pParse,pTrigger);
    }
  }
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTrigger(Parse *pParse, SrcList *pName, int noErr){
  Trigger *pTrigger = 0;
  int i;
  const char *zDb;
  const char *zName;
  sqlite3 *db = pParse->db;

  if( db->mallocFailed ) goto drop_trigger_cleanup;
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto drop_trigger_cleanup;
  }

  assert( pName->nSrc==1 );
  zDb = pName->a[0].zDatabase;
  zName = pName->a[0].zName;
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    if( zDb && sqlite3DbIsNamed(db, j, zDb)==0 ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    pTrigger = sqlite3HashFind(&(db->aDb[j].pSchema->trigHash), zName);
    if( pTrigger ) break;
  }
  if( !pTrigger ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "no such trigger: %S", pName->a);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, zDb);
    }
    pParse->checkSchema = 1;
    goto drop_trigger_cleanup;
  }
  sqlite3DropTriggerPtr(pParse, pTrigger);

drop_trigger_cleanup:
  sqlite3SrcListDelete(db, pName);
}